

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

char * psftp_getcwd(void)

{
  char *pcVar1;
  char *pcVar2;
  int *piVar3;
  size_t __size;
  size_t size;
  
  size = 0x100;
  pcVar1 = (char *)safemalloc(0x100,1,0);
  __size = 0x100;
  while( true ) {
    pcVar2 = getcwd(pcVar1,__size);
    if (pcVar2 != (char *)0x0) {
      return pcVar2;
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0x22) break;
    pcVar1 = (char *)safegrowarray(pcVar1,&size,1,size,1,false);
    __size = size;
  }
  safefree(pcVar1);
  pcVar1 = strerror(*piVar3);
  pcVar1 = dupprintf("[cwd unavailable: %s]",pcVar1);
  return pcVar1;
}

Assistant:

char *psftp_getcwd(void)
{
    char *buffer, *ret;
    size_t size = 256;

    buffer = snewn(size, char);
    while (1) {
        ret = getcwd(buffer, size);
        if (ret != NULL)
            return ret;
        if (errno != ERANGE) {
            sfree(buffer);
            return dupprintf("[cwd unavailable: %s]", strerror(errno));
        }
        /*
         * Otherwise, ERANGE was returned, meaning the buffer
         * wasn't big enough.
         */
        sgrowarray(buffer, size, size);
    }
}